

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void lws_context_destroy2(lws_context *context)

{
  lws_vhost *plVar1;
  char **ppcVar2;
  int iVar3;
  lws_context_per_thread *pt_00;
  char **ppcVar4;
  int local_44;
  int n_1;
  lws_role_ops *ar;
  lws_role_ops **ppxx;
  lws_context_per_thread *pt;
  int n;
  lws_vhost *vh1;
  lws_vhost *vh;
  lws_context *context_local;
  
  _lws_log(8,"%s: ctx %p\n","lws_context_destroy2",context);
  *(ushort *)&context->field_0x510 = *(ushort *)&context->field_0x510 & 0xffef | 0x10;
  for (pt._4_4_ = 0; pt._4_4_ < context->count_threads; pt._4_4_ = pt._4_4_ + 1) {
    pt_00 = context->pt + pt._4_4_;
    lws_seq_destroy_all_on_pt(pt_00);
    ar = (lws_role_ops *)available_roles;
    while (ar->name != (char *)0x0) {
      ppcVar4 = &ar->alpn;
      ppcVar2 = &ar->name;
      ar = (lws_role_ops *)ppcVar4;
      if (*(long *)(*ppcVar2 + 0x18) != 0) {
        (**(code **)(*ppcVar2 + 0x18))(context,0,pt_00,1);
      }
    }
    if (context->event_loop_ops->destroy_pt != (_func_void_lws_context_ptr_int *)0x0) {
      (*context->event_loop_ops->destroy_pt)(context,pt._4_4_);
    }
    while ((pt_00->http).ah_list != (allocated_headers *)0x0) {
      _lws_destroy_ah(pt_00,(pt_00->http).ah_list);
    }
  }
  vh1 = context->vhost_list;
  while (vh1 != (lws_vhost *)0x0) {
    plVar1 = vh1->vhost_next;
    __lws_vhost_destroy2(vh1);
    vh1 = plVar1;
  }
  _lws_log(0x10,"%p: post vh listl\n","lws_context_destroy2");
  while (context->vhost_pending_destruction_list != (lws_vhost *)0x0) {
    __lws_vhost_destroy2(context->vhost_pending_destruction_list);
  }
  _lws_log(0x10,"%p: post pdl\n","lws_context_destroy2");
  lws_stats_log_dump(context);
  lws_ssl_context_destroy(context);
  lws_plat_context_late_destroy(context);
  _lws_log(0x10,"%p: baggage\n","lws_context_destroy2");
  if (context->external_baggage_free_on_destroy != (void *)0x0) {
    free(context->external_baggage_free_on_destroy);
  }
  lws_check_deferred_free(context,0,1);
  if ((context->event_loop_ops->destroy_context2 == (_func_int_lws_context_ptr *)0x0) ||
     (iVar3 = (*context->event_loop_ops->destroy_context2)(context), iVar3 == 0)) {
    _lws_log(0x10,"%p: post dc2\n","lws_context_destroy2");
    if (((byte)context->pt[0].field_0x187 >> 2 & 1) == 0) {
      for (local_44 = 0; local_44 < context->count_threads; local_44 = local_44 + 1) {
        if ((*(byte *)((long)&context->set + (long)local_44 * 0x188 + -0x41) & 1) != 0) {
          _lws_log(0x10,"%p: bailing as inside service\n","lws_context_destroy2");
          return;
        }
      }
    }
    lws_context_destroy3(context);
  }
  else {
    *(ushort *)&context->field_0x510 = *(ushort *)&context->field_0x510 & 0xfdff | 0x200;
  }
  return;
}

Assistant:

void
lws_context_destroy2(struct lws_context *context)
{
#if defined(LWS_WITH_NETWORK)
	struct lws_vhost *vh = NULL, *vh1;
	int n;
#endif
#if defined(LWS_WITH_PEER_LIMITS)
	uint32_t nu;
#endif

	lwsl_info("%s: ctx %p\n", __func__, context);

	lws_context_lock(context, "context destroy 2"); /* ------ context { */

	context->being_destroyed2 = 1;
#if defined(LWS_WITH_NETWORK)

	/*
	 * We're going to trash things like vhost-protocols
	 * So we need to finish dealing with wsi close that
	 * might make callbacks first
	 */
	for (n = 0; n < context->count_threads; n++) {
		struct lws_context_per_thread *pt = &context->pt[n];

		(void)pt;

#if defined(LWS_WITH_SECURE_STREAMS)
		lws_dll2_foreach_safe(&pt->ss_owner, NULL, lws_ss_destroy_dll);
		if (context->ac_policy)
			lwsac_free(&context->ac_policy);
#endif

#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
		lws_dll2_foreach_safe(&pt->ss_client_owner, NULL, lws_sspc_destroy_dll);
#endif

#if defined(LWS_WITH_SEQUENCER)
		lws_seq_destroy_all_on_pt(pt);
#endif
		LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
			if (ar->pt_init_destroy)
				ar->pt_init_destroy(context, NULL, pt, 1);
		} LWS_FOR_EVERY_AVAILABLE_ROLE_END;

#if defined(LWS_WITH_CGI)
		role_ops_cgi.pt_init_destroy(context, NULL, pt, 1);
#endif

		if (context->event_loop_ops->destroy_pt)
			context->event_loop_ops->destroy_pt(context, n);

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		while (pt->http.ah_list)
			_lws_destroy_ah(pt, pt->http.ah_list);
#endif
	}

	/*
	 * free all the per-vhost allocations
	 */

	vh = context->vhost_list;
	while (vh) {
		vh1 = vh->vhost_next;
		__lws_vhost_destroy2(vh);
		vh = vh1;
	}

	lwsl_debug("%p: post vh listl\n", __func__);

	/* remove ourselves from the pending destruction list */

	while (context->vhost_pending_destruction_list)
		/* removes itself from list */
		__lws_vhost_destroy2(context->vhost_pending_destruction_list);
#endif

	lwsl_debug("%p: post pdl\n", __func__);

	lws_stats_log_dump(context);
#if defined(LWS_WITH_NETWORK)
	lws_ssl_context_destroy(context);
#endif
	lws_plat_context_late_destroy(context);

#if defined(LWS_WITH_PEER_LIMITS)
	for (nu = 0; nu < context->pl_hash_elements; nu++)	{
		lws_start_foreach_llp(struct lws_peer **, peer,
				      context->pl_hash_table[nu]) {
			struct lws_peer *df = *peer;
			*peer = df->next;
			lws_free(df);
			continue;
		} lws_end_foreach_llp(peer, next);
	}
	lws_free(context->pl_hash_table);
#endif

	lwsl_debug("%p: baggage\n", __func__);

	if (context->external_baggage_free_on_destroy)
		free(context->external_baggage_free_on_destroy);

#if defined(LWS_WITH_NETWORK)
	lws_check_deferred_free(context, 0, 1);
#endif


#if LWS_MAX_SMP > 1
	lws_mutex_refcount_destroy(&context->mr);
#endif
#if defined(LWS_WITH_NETWORK)
	if (context->event_loop_ops->destroy_context2)
		if (context->event_loop_ops->destroy_context2(context)) {
			lws_context_unlock(context); /* } context ----------- */
			context->finalize_destroy_after_internal_loops_stopped = 1;
			return;
		}

	lwsl_debug("%p: post dc2\n", __func__);

	if (!context->pt[0].event_loop_foreign) {
		int n;
		for (n = 0; n < context->count_threads; n++)
			if (context->pt[n].inside_service) {
				lwsl_debug("%p: bailing as inside service\n", __func__);
				lws_context_unlock(context); /* } context --- */
				return;
			}
	}
#endif
	lws_context_unlock(context); /* } context ------------------- */

	lws_context_destroy3(context);
}